

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O3

void __thiscall
Fl_Graphics_Driver::mult_matrix
          (Fl_Graphics_Driver *this,double a,double b,double c,double d,double x,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->m).a;
  dVar2 = (this->m).b;
  dVar3 = (this->m).c;
  dVar4 = (this->m).d;
  (this->m).a = a * dVar1 + b * dVar3;
  (this->m).b = a * dVar2 + b * dVar4;
  (this->m).c = c * dVar1 + d * dVar3;
  (this->m).d = c * dVar2 + d * dVar4;
  (this->m).x = x * dVar1 + y * dVar3 + (this->m).x;
  (this->m).y = x * dVar2 + y * dVar4 + (this->m).y;
  return;
}

Assistant:

void Fl_Graphics_Driver::mult_matrix(double a, double b, double c, double d, double x, double y) {
  matrix o;
  o.a = a*m.a + b*m.c;
  o.b = a*m.b + b*m.d;
  o.c = c*m.a + d*m.c;
  o.d = c*m.b + d*m.d;
  o.x = x*m.a + y*m.c + m.x;
  o.y = x*m.b + y*m.d + m.y;
  m = o;
}